

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

constant_values * __thiscall cs_impl::any::const_val<cs::constant_values>(any *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  error *peVar3;
  string local_38;
  
  if (this->mDat == (proxy *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*this->mDat->data->_vptr_baseHolder[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  if (*(char **)(puVar2 + 8) != "N2cs15constant_valuesE") {
    iVar1 = strcmp("N2cs15constant_valuesE",*(char **)(puVar2 + 8));
    if (iVar1 != 0) {
      peVar3 = (error *)__cxa_allocate_exception(0x28);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E0006","");
      cov::error::error(peVar3,&local_38);
      __cxa_throw(peVar3,&cov::error::typeinfo,cov::error::~error);
    }
  }
  if (this->mDat != (proxy *)0x0) {
    return (constant_values *)(this->mDat->data + 1);
  }
  peVar3 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E0005","");
  cov::error::error(peVar3,&local_38);
  __cxa_throw(peVar3,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

const T &const_val() const
		{
			if (typeid(T) != this->type())
				throw cov::error("E0006");
			if (this->mDat == nullptr)
				throw cov::error("E0005");
			return static_cast<holder<T> *>(this->mDat->data)->data();
		}